

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::Server(Server *this)

{
  this->_vptr_Server = (_func_int **)&PTR__Server_00186240;
  this->keep_alive_max_count_ = 5;
  this->is_running_ = false;
  this->svr_sock_ = -1;
  (this->base_dir_)._M_dataplus._M_p = (pointer)&(this->base_dir_).field_2;
  (this->base_dir_)._M_string_length = 0;
  (this->base_dir_).field_2._M_local_buf[0] = '\0';
  memset(&this->get_handlers_,0,0xe4);
  signal(0xd,(__sighandler_t)0x1);
  return;
}

Assistant:

inline Server::Server()
    : keep_alive_max_count_(5)
    , is_running_(false)
    , svr_sock_(INVALID_SOCKET)
    , running_threads_(0)
{
#ifndef _WIN32
    signal(SIGPIPE, SIG_IGN);
#endif
}